

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIf.c
# Opt level: O0

void Gia_ManLutParams(Gia_Man_t *p,int *pnCurLuts,int *pnCurEdges,int *pnCurLevels)

{
  int iVar1;
  int iVar2;
  void *__ptr;
  int *piVar3;
  bool bVar4;
  int local_54;
  int Level;
  int *pLevels;
  int local_40;
  int iFan;
  int k;
  int i_1;
  Gia_Obj_t *pObj;
  int i;
  int *pnCurLevels_local;
  int *pnCurEdges_local;
  int *pnCurLuts_local;
  Gia_Man_t *p_local;
  
  if ((p->pManTime == (void *)0x0) || (iVar1 = Tim_ManBoxNum((Tim_Man_t *)p->pManTime), iVar1 == 0))
  {
    iVar1 = Gia_ManObjNum(p);
    __ptr = calloc((long)iVar1,4);
    *pnCurLuts = 0;
    *pnCurEdges = 0;
    for (iFan = 1; iVar1 = Gia_ManObjNum(p), iFan < iVar1; iFan = iFan + 1) {
      iVar1 = Gia_ObjIsLut(p,iFan);
      if (iVar1 != 0) {
        local_54 = 0;
        *pnCurLuts = *pnCurLuts + 1;
        iVar1 = Gia_ObjLutSize(p,iFan);
        *pnCurEdges = iVar1 + *pnCurEdges;
        for (local_40 = 0; iVar1 = Gia_ObjLutSize(p,iFan), local_40 < iVar1; local_40 = local_40 + 1
            ) {
          piVar3 = Gia_ObjLutFanins(p,iFan);
          if (local_54 < *(int *)((long)__ptr + (long)piVar3[local_40] * 4)) {
            local_54 = *(int *)((long)__ptr + (long)piVar3[local_40] * 4);
          }
        }
        *(int *)((long)__ptr + (long)iFan * 4) = local_54 + 1;
      }
    }
    *pnCurLevels = 0;
    local_40 = 0;
    while( true ) {
      iVar1 = Vec_IntSize(p->vCos);
      bVar4 = false;
      if (local_40 < iVar1) {
        _k = Gia_ManCo(p,local_40);
        bVar4 = _k != (Gia_Obj_t *)0x0;
      }
      if (!bVar4) break;
      iVar1 = *pnCurLevels;
      iVar2 = Gia_ObjFaninId0p(p,_k);
      if (iVar1 < *(int *)((long)__ptr + (long)iVar2 * 4)) {
        iVar1 = Gia_ObjFaninId0p(p,_k);
        *pnCurLevels = *(int *)((long)__ptr + (long)iVar1 * 4);
      }
      local_40 = local_40 + 1;
    }
    if (__ptr != (void *)0x0) {
      free(__ptr);
    }
  }
  else {
    *pnCurLuts = 0;
    *pnCurEdges = 0;
    for (pObj._4_4_ = 1; iVar1 = Gia_ManObjNum(p), pObj._4_4_ < iVar1; pObj._4_4_ = pObj._4_4_ + 1)
    {
      iVar1 = Gia_ObjIsLut(p,pObj._4_4_);
      if (iVar1 != 0) {
        *pnCurLuts = *pnCurLuts + 1;
        iVar1 = Gia_ObjLutSize(p,pObj._4_4_);
        *pnCurEdges = iVar1 + *pnCurEdges;
      }
    }
    iVar1 = Gia_ManLutLevelWithBoxes(p);
    *pnCurLevels = iVar1;
  }
  return;
}

Assistant:

void Gia_ManLutParams( Gia_Man_t * p, int * pnCurLuts, int * pnCurEdges, int * pnCurLevels )
{
    if ( p->pManTime && Tim_ManBoxNum((Tim_Man_t *)p->pManTime) )
    {
        int i;
        *pnCurLuts = 0;
        *pnCurEdges = 0;
        Gia_ManForEachLut( p, i )
        {
            (*pnCurLuts)++;
            (*pnCurEdges) += Gia_ObjLutSize(p, i);
        }
        *pnCurLevels = Gia_ManLutLevelWithBoxes( p );
    }
    else
    {
        Gia_Obj_t * pObj;
        int i, k, iFan;
        int * pLevels = ABC_CALLOC( int, Gia_ManObjNum(p) );
        *pnCurLuts = 0;
        *pnCurEdges = 0;
        Gia_ManForEachLut( p, i )
        {
            int Level = 0;
            (*pnCurLuts)++;
            (*pnCurEdges) += Gia_ObjLutSize(p, i);
            Gia_LutForEachFanin( p, i, iFan, k )
                if ( Level < pLevels[iFan] )
                    Level = pLevels[iFan];
            pLevels[i] = Level + 1;
        }
        *pnCurLevels = 0;
        Gia_ManForEachCo( p, pObj, k )
            if ( *pnCurLevels < pLevels[Gia_ObjFaninId0p(p, pObj)] )
                *pnCurLevels = pLevels[Gia_ObjFaninId0p(p, pObj)];
        ABC_FREE( pLevels );
    }
}